

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::DataBreakpointInfoResponse>::~BasicTypeInfo
          (BasicTypeInfo<dap::DataBreakpointInfoResponse> *this)

{
  BasicTypeInfo<dap::DataBreakpointInfoResponse> *this_local;
  
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}